

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::BMI_RL(CPU *this)

{
  int iVar1;
  
  this->cycles = 2;
  iVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->cycles = this->cycles - 1;
  this->pc = (short)(char)((char)(this->field_6).ps >> 7 & (byte)iVar1) + this->pc + 1;
  return;
}

Assistant:

void CPU::BMI_RL()
{
    cycles = 2;
    uint8_t offset = GetByte();
    pc += (N) ? static_cast<int8_t>(offset) : 0;
}